

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modern-coapp.hpp
# Opt level: O1

pdu * coapp::pdu::from(pdu *__return_storage_ptr__,bytes_t *bytes)

{
  _Rb_tree_header *p_Var1;
  ushort *puVar2;
  byte *pbVar3;
  byte bVar4;
  pointer puVar5;
  pointer **pppuVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  byte *pbVar13;
  allocator_type local_69;
  pair<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_68;
  pointer local_48;
  pointer puStack_40;
  pointer puStack_38;
  
  pbVar10 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar5 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)((long)puVar5 - (long)pbVar10) < 4) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = &PTR__exception_0018beb8;
    __cxa_throw(puVar9,&invalid_pdu::typeinfo,std::exception::~exception);
  }
  __return_storage_ptr__->_version = '\x01';
  __return_storage_ptr__->_type = Confirmable;
  __return_storage_ptr__->_code = Empty;
  __return_storage_ptr__->_message_id = 0;
  (__return_storage_ptr__->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(__return_storage_ptr__->_options)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->_payload)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_payload).field_2;
  (__return_storage_ptr__->_payload)._M_string_length = 0;
  (__return_storage_ptr__->_payload).field_2._M_local_buf[0] = '\0';
  bVar4 = *pbVar10;
  __return_storage_ptr__->_version = bVar4 >> 6;
  if (bVar4 >> 6 != 1) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = &PTR__exception_0018beb8;
    __cxa_throw(puVar9,&invalid_pdu::typeinfo,std::exception::~exception);
  }
  __return_storage_ptr__->_type = *pbVar10 >> 4 & Reset;
  bVar4 = *pbVar10;
  if (8 < (byte)(bVar4 & 0xf)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = &PTR__exception_0018beb8;
    __cxa_throw(puVar9,&invalid_pdu::typeinfo,std::exception::~exception);
  }
  __return_storage_ptr__->_code = pbVar10[1];
  __return_storage_ptr__->_message_id =
       *(ushort *)(pbVar10 + 2) << 8 | *(ushort *)(pbVar10 + 2) >> 8;
  __last._M_current = pbVar10 + (ulong)(bVar4 & 0xf) + 4;
  if (puVar5 < __last._M_current) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = &PTR__exception_0018beb8;
    __cxa_throw(puVar9,&invalid_pdu::typeinfo,std::exception::~exception);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_68,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(pbVar10 + 4),__last,(allocator_type *)&local_48);
  Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&__return_storage_ptr__->_token,&local_68);
  if ((pointer *)local_68._0_8_ != (pointer *)0x0) {
    operator_delete((void *)local_68._0_8_,
                    (long)local_68.second.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - local_68._0_8_);
  }
  if (__last._M_current <
      (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pbVar10 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (__last._M_current < pbVar10) {
      iVar11 = 0;
      do {
        bVar4 = *__last._M_current;
        if (bVar4 == 0xff) break;
        uVar12 = (uint)(bVar4 >> 4);
        if (uVar12 == 0xd) {
          pbVar13 = __last._M_current + 1;
          uVar12 = __last._M_current[1] + 0xd;
        }
        else if (uVar12 == 0xe) {
          pbVar13 = __last._M_current + 2;
          uVar12 = (ushort)(*(ushort *)(__last._M_current + 1) << 8 |
                           *(ushort *)(__last._M_current + 1) >> 8) + 0x10d;
        }
        else {
          pbVar13 = __last._M_current;
          if (uVar12 == 0xf) goto LAB_0014740f;
        }
        uVar7 = bVar4 & 0xf;
        uVar8 = (ulong)uVar7;
        if (uVar8 == 0xd) {
          pbVar3 = pbVar13 + 1;
          pbVar13 = pbVar13 + 1;
          uVar8 = (ulong)*pbVar3 + 0xd;
        }
        else if (uVar7 == 0xe) {
          puVar2 = (ushort *)(pbVar13 + 1);
          pbVar13 = pbVar13 + 2;
          uVar8 = (ulong)(ushort)(*puVar2 << 8 | *puVar2 >> 8) + 0x10d;
        }
        else if (uVar7 == 0xf) {
LAB_0014740f:
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = &PTR__exception_0018beb8;
          __cxa_throw(puVar9,&invalid_pdu::typeinfo,std::exception::~exception);
        }
        __last._M_current = pbVar13 + uVar8 + 1;
        if (pbVar10 < __last._M_current) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = &PTR__exception_0018beb8;
          __cxa_throw(puVar9,&invalid_pdu::typeinfo,std::exception::~exception);
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(pbVar13 + 1),__last,&local_69);
        iVar11 = iVar11 + uVar12;
        local_68.first = iVar11;
        local_68.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_48;
        local_68.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_40;
        local_68.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puStack_38;
        local_48 = (pointer)0x0;
        puStack_40 = (pointer)0x0;
        puStack_38 = (pointer)0x0;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_equal<std::pair<unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&__return_storage_ptr__->_options,&local_68);
        if (local_68.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.second.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68.second.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.second.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_48 != (pointer)0x0) {
          operator_delete(local_48,(long)puStack_38 - (long)local_48);
        }
        pbVar10 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
      } while (__last._M_current < pbVar10);
    }
    if (__last._M_current < pbVar10) {
      pppuVar6 = (pointer **)
                 &local_68.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      local_68._0_8_ = pppuVar6;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)&local_68,__last._M_current + 1);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->_payload,(string *)&local_68);
      if ((pointer **)local_68._0_8_ != pppuVar6) {
        operator_delete((void *)local_68._0_8_,
                        (ulong)(local_68.second.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static pdu from(bytes_t bytes)
    {
        /*

        PDU contains at least 4 bytes:

        0                   1                   2                   3
        0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1
        +-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+
        |Ver| T |  TKL  |      Code     |          Message ID           |
        +-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+

        */
        if (bytes.size() < 4)
            throw invalid_pdu();

        pdu result;

        const auto& header = bytes[0];

        result._version = header >> 6;
        if (result._version != 1)
            throw invalid_pdu();

        result._type = static_cast<Type>((header & 0b00110000) >> 4);
        auto token_length = (header & 0b00001111);
        if (token_length > 8)
            throw invalid_pdu();

        result._code = static_cast<Code>(bytes[1]);
        result._message_id = (bytes[2] << 8) | (bytes[3]);

        // Parse token
        auto token_offset = bytes.begin() + 4;
        auto it = token_offset + token_length;

        if (it > bytes.end())
            throw invalid_pdu();

        result._token = { token_offset, it };

        if (it >= bytes.end())
            return result; // No options or payload

        // Parse options
        // Options and payload are separated by a FF byte
        option_number_t option_number = 0;
        while (it < bytes.end() && (*it) != 0xff) {
            // https://datatracker.ietf.org/doc/html/rfc7252#section-3.1

            uint32_t option_delta = *it >> 4;
            uint32_t option_length = *it & 0b00001111;

            auto parse_value = [&] (uint32_t& val) {
                if (val == 13)
                    val = 13 + *(++it);
                else if (val == 14)
                    val = 269 + ((*(++it) << 8) | (*(++it)));
                else if (val == 15)
                    throw invalid_pdu();
            };

            parse_value(option_delta);
            parse_value(option_length);

            it++;
            auto option_end = it + option_length;
            if (option_end > bytes.end())
                throw invalid_pdu();

            option_number += option_delta;
            result._options.emplace(std::make_pair(
                option_number,
                option_value_t { it, option_end }
            ));

            it = option_end;
        }

        if (it >= bytes.end())
            return result; // No payload

        // Skip the payload separator
        it++;

        // Rest of the PDU is payload
        result._payload = { it, bytes.end() };

        return result;
    }